

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkRenderingInputAttachmentIndexInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkRenderingInputAttachmentIndexInfo>
          (Impl *this,VkRenderingInputAttachmentIndexInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkRenderingInputAttachmentIndexInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkRenderingInputAttachmentIndexInfo>(alloc,count);
    if (pVVar1 != (VkRenderingInputAttachmentIndexInfo *)0x0) {
      pVVar1 = (VkRenderingInputAttachmentIndexInfo *)memmove(pVVar1,src,count * 0x30);
      return pVVar1;
    }
  }
  return (VkRenderingInputAttachmentIndexInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}